

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::js::Generator::GenerateFile
          (Generator *this,FileDescriptor *file,GeneratorOptions *options,GeneratorContext *context,
          bool use_short_name)

{
  bool bVar1;
  int iVar2;
  string *psVar3;
  string *psVar4;
  undefined4 extraout_var;
  LogMessage *other;
  pointer output_00;
  AnnotationCollector **local_248;
  undefined1 local_1f0 [8];
  Printer printer;
  AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> annotation_collector;
  GeneratedCodeInfo annotations;
  LogMessage local_108;
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  local_d0;
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  output;
  string local_b8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined1 local_58 [8];
  string filename;
  bool use_short_name_local;
  GeneratorContext *context_local;
  GeneratorOptions *options_local;
  FileDescriptor *file_local;
  Generator *this_local;
  
  filename.field_2._M_local_buf[0xf] = use_short_name;
  std::operator+(&local_78,&options->output_dir,"/");
  if ((filename.field_2._M_local_buf[0xf] & 1U) == 0) {
    psVar3 = FileDescriptor::name_abi_cxx11_(file);
    std::__cxx11::string::string((string *)&local_b8,(string *)psVar3);
  }
  else {
    psVar3 = FileDescriptor::name_abi_cxx11_(file);
    psVar4 = FileDescriptor::name_abi_cxx11_(file);
    std::__cxx11::string::rfind((char)psVar4,0x2f);
    std::__cxx11::string::substr((ulong)&local_b8,(ulong)psVar3);
  }
  anon_unknown_0::GetJSFilename(&local_98,options,&local_b8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                 &local_78,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_78);
  iVar2 = (*context->_vptr_GeneratorContext[2])(context,local_58);
  std::
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,std::default_delete<google::protobuf::io::ZeroCopyOutputStream>>
  ::unique_ptr<std::default_delete<google::protobuf::io::ZeroCopyOutputStream>,void>
            ((unique_ptr<google::protobuf::io::ZeroCopyOutputStream,std::default_delete<google::protobuf::io::ZeroCopyOutputStream>>
              *)&local_d0,(pointer)CONCAT44(extraout_var,iVar2));
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_d0);
  annotations._47_1_ = 0;
  if (!bVar1) {
    internal::LogMessage::LogMessage
              (&local_108,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/js/js_generator.cc"
               ,0xe09);
    annotations._47_1_ = 1;
    other = internal::LogMessage::operator<<(&local_108,"CHECK failed: output: ");
    internal::LogFinisher::operator=((LogFinisher *)&annotations.field_0x2e,other);
  }
  if ((annotations._47_1_ & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_108);
  }
  GeneratedCodeInfo::GeneratedCodeInfo((GeneratedCodeInfo *)&annotation_collector.annotation_proto_)
  ;
  io::AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo>::AnnotationProtoCollector
            ((AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> *)
             &printer.annotation_collector_,
             (GeneratedCodeInfo *)&annotation_collector.annotation_proto_);
  output_00 = std::
              unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
              ::get(&local_d0);
  if ((options->annotate_code & 1U) == 0) {
    local_248 = (AnnotationCollector **)0x0;
  }
  else {
    local_248 = &printer.annotation_collector_;
  }
  io::Printer::Printer((Printer *)local_1f0,output_00,'$',(AnnotationCollector *)local_248);
  GenerateFile(this,options,(Printer *)local_1f0,file);
  bVar1 = io::Printer::failed((Printer *)local_1f0);
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else {
    if ((options->annotate_code & 1U) != 0) {
      anon_unknown_0::EmbedCodeAnnotations
                ((GeneratedCodeInfo *)&annotation_collector.annotation_proto_,(Printer *)local_1f0);
    }
    this_local._7_1_ = true;
  }
  io::Printer::~Printer((Printer *)local_1f0);
  io::AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo>::~AnnotationProtoCollector
            ((AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> *)
             &printer.annotation_collector_);
  GeneratedCodeInfo::~GeneratedCodeInfo
            ((GeneratedCodeInfo *)&annotation_collector.annotation_proto_);
  std::
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  ::~unique_ptr(&local_d0);
  std::__cxx11::string::~string((string *)local_58);
  return this_local._7_1_;
}

Assistant:

bool Generator::GenerateFile(const FileDescriptor* file,
                             const GeneratorOptions& options,
                             GeneratorContext* context,
                             bool use_short_name) const {
  std::string filename =
      options.output_dir + "/" +
      GetJSFilename(options, use_short_name
                                 ? file->name().substr(file->name().rfind('/'))
                                 : file->name());
  std::unique_ptr<io::ZeroCopyOutputStream> output(context->Open(filename));
  GOOGLE_CHECK(output);
  GeneratedCodeInfo annotations;
  io::AnnotationProtoCollector<GeneratedCodeInfo> annotation_collector(
      &annotations);
  io::Printer printer(output.get(), '$',
                      options.annotate_code ? &annotation_collector : nullptr);

  GenerateFile(options, &printer, file);

  if (printer.failed()) {
    return false;
  }

  if (options.annotate_code) {
    EmbedCodeAnnotations(annotations, &printer);
  }

  return true;
}